

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddBridge.c
# Opt level: O1

DdNode * Cudd_addBddPattern(DdManager *dd,DdNode *f)

{
  DdNode *pDVar1;
  
  do {
    dd->reordered = 0;
    pDVar1 = cuddAddBddDoPattern(dd,f);
  } while (dd->reordered == 1);
  return pDVar1;
}

Assistant:

DdNode *
Cudd_addBddPattern(
  DdManager * dd,
  DdNode * f)
{
    DdNode *res;
    
    do {
        dd->reordered = 0;
        res = cuddAddBddDoPattern(dd, f);
    } while (dd->reordered == 1);
    return(res);

}